

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void phmap::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *ctrl,size_t capacity)

{
  long in_RSI;
  ctrl_t *in_RDI;
  ctrl_t *pos;
  GroupSse2Impl GStack_28;
  ctrl_t *local_18;
  long local_10;
  ctrl_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = in_RDI; local_18 != local_8 + local_10 + 1; local_18 = local_18 + 0x10) {
    GroupSse2Impl::GroupSse2Impl(&GStack_28,local_18);
    GroupSse2Impl::ConvertSpecialToEmptyAndFullToDeleted(&GStack_28,local_18);
  }
  *(undefined8 *)(local_8 + local_10 + 1) = *(undefined8 *)local_8;
  *(undefined8 *)(local_8 + local_10 + 9) = *(undefined8 *)(local_8 + 8);
  local_8[local_10] = -1;
  return;
}

Assistant:

inline void ConvertDeletedToEmptyAndFullToDeleted(
    ctrl_t* ctrl, size_t capacity) 
{
    assert(ctrl[capacity] == kSentinel);
    assert(IsValidCapacity(capacity));
    for (ctrl_t* pos = ctrl; pos != ctrl + capacity + 1; pos += Group::kWidth) {
        Group{pos}.ConvertSpecialToEmptyAndFullToDeleted(pos);
    }
    // Copy the cloned ctrl bytes.
    std::memcpy(ctrl + capacity + 1, ctrl, Group::kWidth);
    ctrl[capacity] = kSentinel;
}